

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * str_cpynextword(char *dst,char *src,size_t len)

{
  ushort **ppuVar1;
  bool bVar2;
  ulong local_30;
  size_t i;
  size_t len_local;
  char *src_local;
  char *dst_local;
  
  len_local = (size_t)src;
  if (src == (char *)0x0) {
    *dst = '\0';
    dst_local = (char *)0x0;
  }
  else {
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*(char *)len_local] & 1) != 0) {
      len_local = len_local + 1;
    }
    local_30 = 0;
    while( true ) {
      bVar2 = false;
      if (*(char *)len_local != '\0') {
        ppuVar1 = __ctype_b_loc();
        bVar2 = false;
        if (((*ppuVar1)[(int)*(char *)len_local] & 1) == 0) {
          bVar2 = local_30 < len - 1;
        }
      }
      if (!bVar2) break;
      dst[local_30] = *(char *)len_local;
      local_30 = local_30 + 1;
      len_local = len_local + 1;
    }
    dst[local_30] = '\0';
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*(char *)len_local] & 1) != 0) {
      len_local = len_local + 1;
    }
    if (*(char *)len_local == '\0') {
      dst_local = (char *)0x0;
    }
    else {
      dst_local = (char *)len_local;
    }
  }
  return dst_local;
}

Assistant:

const char *
str_cpynextword(char *dst, const char *src, size_t len) {
  size_t i;

  /* sanity check */
  if (src == NULL) {
    *dst = 0;
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*src)) {
    src++;
  }

  /* copy next word */
  i = 0;
  while (*src != 0 && !isblank(*src) && i < len - 1) {
    dst[i++] = *src++;
  }

  /* terminate */
  dst[i] = 0;

  /* skip ahead in src */
  while (isblank(*src)) {
    src++;
  }

  if (*src) {
    /* return next word */
    return src;
  }

  /* end of src */
  return NULL;
}